

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O1

void __thiscall CLabelTable::DumpForCSpect(CLabelTable *this)

{
  pointer *ppbVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  mapped_type *pmVar4;
  char *pcVar5;
  SLabelTableEntry *pSVar6;
  int iVar7;
  char cVar8;
  key_type *name;
  pointer __k;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  order;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  
  __stream = (FILE *)SJ_fopen((path *)&Options::CSpectMapFName_abi_cxx11_,"w");
  if (__stream == (FILE *)0x0) {
    ppbVar1 = &local_50.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_50.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,Options::CSpectMapFName_abi_cxx11_,
               DAT_0018d4a8 + Options::CSpectMapFName_abi_cxx11_);
    Error("opening file for write",
          (char *)local_50.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,FATAL);
    if (local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
      operator_delete(local_50.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((local_50.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
  }
  iVar3 = Options::CSpectMapPageSize;
  getDumpOrder(&local_50,&this->symbols);
  if (local_50.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_50.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __k = local_50.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>_>
               ::at(&this->symbols,__k);
      iVar7 = (int)pmVar4->page;
      if (iVar7 != -1) {
        uVar2 = pmVar4->traits;
        cVar8 = '\0';
        if (((((uVar2 & 0x10) == 0) && (cVar8 = '\x04', (uVar2 & 8) == 0)) &&
            (cVar8 = '\x01', (uVar2 & 4) == 0)) && (cVar8 = '\x02', (uVar2 & 2) == 0)) {
          cVar8 = (0x7eff < iVar7) * '\x03';
        }
        if (cVar8 != '\0') {
          iVar7 = 0;
        }
        fprintf(__stream,"%08X %08X %02X ",(ulong)(pmVar4->value & 0xffff),
                (ulong)(iVar7 * iVar3 + (pmVar4->value & iVar3 - 1U)));
        strcpy(temp,(__k->_M_dataplus)._M_p);
        pcVar5 = strrchr(temp,0x2e);
        if (temp < pcVar5) {
          do {
            *pcVar5 = '\0';
            pSVar6 = Find(this,temp,true);
            if (pSVar6 != (SLabelTableEntry *)0x0) {
              *pcVar5 = '@';
              break;
            }
            *pcVar5 = '.';
            do {
              pcVar5 = pcVar5 + -1;
              if (pcVar5 < temp + 1) break;
            } while (*pcVar5 != '.');
          } while (temp < pcVar5);
        }
        pcVar5 = temp;
        do {
          iVar7 = toupper((uint)(byte)*pcVar5);
          *pcVar5 = (byte)iVar7;
          pcVar5 = (char *)((byte *)pcVar5 + 1);
        } while ((byte)iVar7 != 0);
        fprintf(__stream,"%s\n",temp);
      }
      __k = __k + 1;
    } while (__k != local_50.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  fclose(__stream);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  return;
}

Assistant:

void CLabelTable::DumpForCSpect() {
	FILE* file;
	if (!FOPEN_ISOK(file, Options::CSpectMapFName, "w")) {
		Error("opening file for write", Options::CSpectMapFName.string().c_str(), FATAL);
	}
	const int CSD_PAGE_SIZE = Options::CSpectMapPageSize;
	const int CSD_PAGE_MASK = CSD_PAGE_SIZE - 1;
	const auto order = getDumpOrder(symbols);
	for (const symbol_map_t::key_type& name: order) {
		const symbol_map_t::mapped_type& symbol = symbols.at(name);
		if (LABEL_PAGE_UNDEFINED == symbol.page) continue;
		const int labelType =
			(symbol.traits&LABEL_IS_STRUCT_E) ? 0 :
			(symbol.traits&LABEL_IS_STRUCT_D) ? 4 :
			(symbol.traits&LABEL_IS_EQU) ? 1 :
			(symbol.traits&LABEL_IS_DEFL) ? 2 :
			(LABEL_PAGE_ROM <= symbol.page) ? 3 : 0;
		const short page = labelType ? 0 : symbol.page;
			// TODO:
			// page == -1 will put regular EQU like "BLUE" out of reach for disassembly window
			// (otherwise BLUE becomes label for address $C001 with default mapping)
			// BUT then it would be nice to provide real page data for equ which have them explicit
			// BUT I can't distinguish explicit/implicit page number, as there's heuristic to use current mapping
			// instead of using the LABEL_PAGE_OUT_OF_BOUNDS page number...
			// TODO: figure out when/why the implicit page number heuristic happenned and if you can detect
			// only explicit page numbers used in EQU, and export only those

		const aint longAddress = (CSD_PAGE_MASK & symbol.value) + page * CSD_PAGE_SIZE;
		fprintf(file, "%08X %08X %02X ", 0xFFFF & symbol.value, longAddress, labelType);
		// convert primary+local label to be "@" delimited (not "." delimited)
		STRCPY(temp, LINEMAX, name.c_str());
		// look for "primary" label (where the local label starts)
		char* localLabelStart = strrchr(temp, '.');
		while (temp < localLabelStart) {	// the dot must be at least second character
			*localLabelStart = 0;			// terminate the possible "primary" part
			if (Find(temp, true)) {
				*localLabelStart = '@';
				break;
			}
			*localLabelStart = '.';			// "primary" label didn't work, restore dot
			do {
				--localLabelStart;			// and look for next dot
			} while (temp < localLabelStart && '.' != *localLabelStart);
		}
		// convert whole label to upper-case, as CSpect search is malfunctioning otherwise.
		char* strToUpper = temp;
		while ((*strToUpper = (char) toupper((byte)*strToUpper))) { ++strToUpper; }
		fprintf(file, "%s\n", temp);
	}
	fclose(file);
}